

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::MemoryDataParameter::MergePartialFromCodedStream
          (MemoryDataParameter *this,CodedInputStream *input)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  uint32 uVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  UnknownFieldSet *unknown_fields;
  char cVar8;
  uint tag;
  ulong uVar9;
  
  do {
    pbVar5 = input->buffer_;
    uVar4 = 0;
    if (pbVar5 < input->buffer_end_) {
      bVar1 = *pbVar5;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b0b04;
      input->buffer_ = pbVar5 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b0b04:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar9 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar4 | uVar9;
    }
    tag = (uint)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_003b0b88_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pbVar5 = input->buffer_;
      if (input->buffer_end_ <= pbVar5) {
        uVar4 = 0;
LAB_003b0c5e:
        lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        this->batch_size_ = (uint32)lVar6;
        goto LAB_003b0c7a;
      }
      bVar1 = *pbVar5;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003b0c5e;
      this->batch_size_ = (uint)bVar1;
LAB_003b0c24:
      input->buffer_ = pbVar5 + 1;
      goto LAB_003b0c82;
    case 2:
      if (cVar8 != '\x10') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar5 = input->buffer_;
      if (pbVar5 < input->buffer_end_) {
        bVar1 = *pbVar5;
        uVar4 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->channels_ = (uint)bVar1;
          goto LAB_003b0c24;
        }
      }
      else {
        uVar4 = 0;
      }
      lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
      this->channels_ = (uint32)lVar6;
LAB_003b0c7a:
      iVar7 = 6;
      if (-1 < lVar6) goto LAB_003b0c82;
      goto LAB_003b0c84;
    case 3:
      if (cVar8 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar5 = input->buffer_;
        if (pbVar5 < input->buffer_end_) {
          bVar1 = *pbVar5;
          uVar4 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->height_ = (uint)bVar1;
            goto LAB_003b0c24;
          }
        }
        else {
          uVar4 = 0;
        }
        lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        this->height_ = (uint32)lVar6;
        goto LAB_003b0c7a;
      }
      break;
    case 4:
      if (cVar8 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pbVar5 = input->buffer_;
        if (pbVar5 < input->buffer_end_) {
          bVar1 = *pbVar5;
          uVar4 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->width_ = (uint)bVar1;
            goto LAB_003b0c24;
          }
        }
        else {
          uVar4 = 0;
        }
        lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        this->width_ = (uint32)lVar6;
        goto LAB_003b0c7a;
      }
    }
switchD_003b0b88_default:
    iVar7 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar2 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar2 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
      }
      bVar3 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
      iVar7 = 6;
      if (bVar3) {
LAB_003b0c82:
        iVar7 = 0;
      }
    }
LAB_003b0c84:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool MemoryDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.MemoryDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 batch_size = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 channels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_channels();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &channels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 height = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 width = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.MemoryDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.MemoryDataParameter)
  return false;
#undef DO_
}